

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall Socket::Poll::Private::set(Private *this,Socket *socket,uint events)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  Iterator *other;
  SocketInfo *key;
  Iterator *other_00;
  SocketInfo local_88;
  Socket *local_78;
  SocketInfo *local_70;
  SocketInfo *sockInfo_1;
  SOCKET s;
  uint *local_58;
  uint *selectedEvents;
  Iterator it_1;
  uint removedEvents;
  SocketInfo *sockInfo;
  Iterator local_30;
  Iterator it;
  epoll_event ev;
  uint events_local;
  Socket *socket_local;
  Private *this_local;
  
  sockInfo = (SocketInfo *)socket;
  local_30 = HashMap<Socket_*,_Socket::Poll::Private::SocketInfo>::find
                       (&this->sockets,(Socket **)&sockInfo);
  other = HashMap<Socket_*,_Socket::Poll::Private::SocketInfo>::end(&this->sockets);
  bVar2 = HashMap<Socket_*,_Socket::Poll::Private::SocketInfo>::Iterator::operator!=
                    (&local_30,other);
  if (bVar2) {
    key = HashMap<Socket_*,_Socket::Poll::Private::SocketInfo>::Iterator::operator*(&local_30);
    if (key->events != events) {
      it_1.item._4_4_ = key->events & (events ^ 0xffffffff);
      key->events = events;
      it.item._0_4_ = mapEvents(events);
      unique0x10000284 = key;
      iVar3 = epoll_ctl(this->fd,3,socket->s,(epoll_event *)&it);
      if ((iVar3 != 0) &&
         (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Socket/Socket.cpp"
                                ,0x4bc,"epoll_ctl(fd, EPOLL_CTL_MOD, socket.s, &ev) == 0"),
         iVar3 != 0)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      selectedEvents =
           (uint *)HashMap<Socket_*,_unsigned_int>::find(&this->selectedSockets,&key->socket);
      other_00 = HashMap<Socket_*,_unsigned_int>::end(&this->selectedSockets);
      bVar2 = HashMap<Socket_*,_unsigned_int>::Iterator::operator!=
                        ((Iterator *)&selectedEvents,other_00);
      if (bVar2) {
        local_58 = HashMap<Socket_*,_unsigned_int>::Iterator::operator*((Iterator *)&selectedEvents)
        ;
        *local_58 = (it_1.item._4_4_ ^ 0xffffffff) & *local_58;
        if (*local_58 == 0) {
          HashMap<Socket_*,_unsigned_int>::remove(&this->selectedSockets,(char *)&selectedEvents);
        }
      }
    }
  }
  else {
    sockInfo_1._4_4_ = socket->s;
    if (sockInfo_1._4_4_ != -1) {
      local_78 = socket;
      memset(&local_88,0,0x10);
      local_70 = HashMap<Socket_*,_Socket::Poll::Private::SocketInfo>::append
                           (&this->sockets,&local_78,&local_88);
      local_70->s = sockInfo_1._4_4_;
      local_70->socket = socket;
      local_70->events = events;
      it.item._0_4_ = mapEvents(events);
      stack0xffffffffffffffdc = local_70;
      iVar3 = epoll_ctl(this->fd,1,sockInfo_1._4_4_,(epoll_event *)&it);
      if ((iVar3 != 0) &&
         (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Socket/Socket.cpp"
                                ,0x4d1,"epoll_ctl(fd, EPOLL_CTL_ADD, s, &ev) == 0"), iVar3 != 0)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
  }
  return;
}

Assistant:

void Socket::Poll::Private::set(Socket& socket, uint events)
{
  epoll_event ev;
  HashMap<Socket*, Private::SocketInfo>::Iterator it = sockets.find(&socket);
  if(it != sockets.end())
  {
    Private::SocketInfo& sockInfo = *it;
    if(sockInfo.events == events)
      return;
    uint removedEvents = sockInfo.events & ~events;
    sockInfo.events = events;
    ev.events = mapEvents(events);
    ev.data.ptr = &sockInfo;
    VERIFY(epoll_ctl(fd, EPOLL_CTL_MOD, socket.s, &ev) == 0);
    HashMap<Socket*, uint>::Iterator it = selectedSockets.find(sockInfo.socket);
    if(it != selectedSockets.end())
    {
      uint& selectedEvents = *it;
      selectedEvents &= ~removedEvents;
      if(selectedEvents == 0)
        selectedSockets.remove(it);
    }
  }
  else
  {
    SOCKET s = socket.s;
    if(s == INVALID_SOCKET)
      return;
    Private::SocketInfo& sockInfo = sockets.append(&socket, Private::SocketInfo());
    sockInfo.s = s;
    sockInfo.socket = &socket;
    sockInfo.events = events;
    ev.events = mapEvents(events);
    ev.data.ptr = &sockInfo;
    VERIFY(epoll_ctl(fd, EPOLL_CTL_ADD, s, &ev) == 0);
  }
}